

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_read(_garray *x,t_symbol *filename)

{
  uint uVar1;
  int iVar2;
  _glist *x_00;
  double local_438;
  double f;
  _array *array;
  int elemsize;
  int yonset;
  char *bufptr;
  char buf [1000];
  FILE *fd;
  int i;
  int filedesc;
  int nelem;
  t_symbol *filename_local;
  _garray *x_local;
  
  f = (double)garray_getarray_floatonly(x,(int *)((long)&array + 4),(int *)&array);
  if ((_array *)f == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
  }
  else {
    uVar1 = ((_array *)f)->a_n;
    x_00 = glist_getcanvas(x->x_glist);
    iVar2 = canvas_open(x_00,filename->s_name,"",(char *)&bufptr,(char **)&elemsize,1000,0);
    if ((iVar2 < 0) || (buf._992_8_ = fdopen(iVar2,"r"), (FILE *)buf._992_8_ == (FILE *)0x0)) {
      pd_error((void *)0x0,"%s: can\'t open",filename->s_name);
    }
    else {
      for (fd._4_4_ = 0; (int)fd._4_4_ < (int)uVar1; fd._4_4_ = fd._4_4_ + 1) {
        iVar2 = __isoc99_fscanf(buf._992_8_,"%lf",&local_438);
        if (iVar2 == 0) {
          post("%s: read %d elements into table of size %d",filename->s_name,(ulong)fd._4_4_,
               (ulong)uVar1);
          break;
        }
        *(float *)(*(long *)((long)f + 8) + (long)(int)((int)array * fd._4_4_) +
                  (long)array._4_4_ * 4) = (float)local_438;
      }
      for (; (int)fd._4_4_ < (int)uVar1; fd._4_4_ = fd._4_4_ + 1) {
        *(undefined4 *)
         (*(long *)((long)f + 8) + (long)(int)((int)array * fd._4_4_) + (long)array._4_4_ * 4) = 0;
      }
      fclose((FILE *)buf._992_8_);
      garray_redraw(x);
    }
  }
  return;
}

Assistant:

static void garray_read(t_garray *x, t_symbol *filename)
{
    int nelem, filedesc, i;
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    nelem = array->a_n;
    if ((filedesc = canvas_open(glist_getcanvas(x->x_glist),
            filename->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0
                || !(fd = fdopen(filedesc, "r")))
    {
        pd_error(0, "%s: can't open", filename->s_name);
        return;
    }
    for (i = 0; i < nelem; i++)
    {
        double f;
        if (!fscanf(fd, "%lf", &f))
        {
            post("%s: read %d elements into table of size %d",
                filename->s_name, i, nelem);
            break;
        }
        else *((t_float *)(array->a_vec + elemsize * i) + yonset) = f;
    }
    while (i < nelem)
        *((t_float *)(array->a_vec +
            elemsize * i) + yonset) = 0, i++;
    fclose(fd);
    garray_redraw(x);
}